

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O3

void __thiscall
StackTraceTableTestHelper::CheckTracesAndReset
          (StackTraceTableTestHelper *this,uintptr_t *expected,int len)

{
  char *message;
  long lVar1;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  void *local_40;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> retval;
  
  tcmalloc::ProduceStackTracesDump
            ((tcmalloc *)&local_40,DumpTraces::anon_class_1_0_00000001::__invoke,
             (this->head_)._M_t.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl);
  std::
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::reset((__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           *)this,(pointer)0x0);
  if (0 < len) {
    lVar1 = 0;
    do {
      retval._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
      super__Head_base<0UL,_void_**,_false>._M_head_impl =
           *(__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true> *)
            &((__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_> *)((long)local_40 + lVar1))->
             _M_t;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_50,"reinterpret_cast<uintptr_t>(entries[i])","expected[i]",
                 (unsigned_long *)&retval,(unsigned_long *)((long)expected + lVar1));
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&retval);
        message = "";
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_48->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stack_trace_table_test.cc"
                   ,0x33,message);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&retval);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>)
            retval._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
            super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
            super__Head_base<0UL,_void_**,_false>._M_head_impl !=
            (__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>)0x0) {
          (**(code **)(*(long *)retval._M_t.
                                super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                                super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                                super__Head_base<0UL,_void_**,_false>._M_head_impl + 8))();
        }
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)len << 3 != lVar1);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return;
}

Assistant:

void CheckTracesAndReset(const uintptr_t* expected, int len) {
    std::unique_ptr<void*[]> entries = DumpTraces();
    for (int i = 0; i < len; i++) {
      EXPECT_EQ(reinterpret_cast<uintptr_t>(entries[i]), expected[i]);
    }
  }